

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool __thiscall
fmt::v10::format_facet<std::locale>::do_put
          (format_facet<std::locale> *this,appender out,loc_value val,format_specs<char> *specs)

{
  byte bVar1;
  loc_value *in_RDX;
  loc_writer<char> *in_RSI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffff40;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  std::__cxx11::string::string(local_78,(string *)(in_RDI + 0x10));
  std::__cxx11::string::string(local_58,(string *)(in_RDI + 0x30));
  std::__cxx11::string::string(local_38,(string *)(in_RDI + 0x50));
  bVar1 = loc_value::visit<fmt::v10::detail::loc_writer<char>>(in_RDX,in_RSI);
  v10::detail::loc_writer<char>::~loc_writer
            ((loc_writer<char> *)CONCAT17(bVar1,in_stack_ffffffffffffff40));
  return (bool)(bVar1 & 1);
}

Assistant:

FMT_API FMT_FUNC auto format_facet<std::locale>::do_put(
    appender out, loc_value val, const format_specs<>& specs) const -> bool {
  return val.visit(
      detail::loc_writer<>{out, specs, separator_, grouping_, decimal_point_});
}